

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O1

void __thiscall
countConversions_rotations_Test::~countConversions_rotations_Test
          (countConversions_rotations_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(countConversions, rotations)
{
    using namespace units;
    EXPECT_NEAR(convert(Hz, rad / s), 2.0 * constants::pi, test::tolerance);
    EXPECT_NEAR(
        convert(rad, one), 1.0 / (2.0 * constants::pi), test::tolerance);
    EXPECT_NEAR(
        convert(2.0 * constants::pi, rad / s, Hz), 1.0, test::tolerance);
    EXPECT_NEAR(
        convert(1.0 / (2.0 * constants::pi), one, rad), 1.0, test::tolerance);
    // failed conversion
    EXPECT_TRUE(std::isnan(convert(rad.pow(2), count)));
    EXPECT_TRUE(std::isnan(convert(rad.pow(3), one)));
}